

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationInvarianceTests.cpp
# Opt level: O1

void __thiscall
vkt::tessellation::anon_unknown_0::InvariantOuterEdge::BaseTestInstance::BaseTestInstance
          (BaseTestInstance *this,Context *context,CaseDefinition caseDef,int numPatchesToDraw)

{
  Unique<vk::Handle<(vk::HandleType)19>_> *pUVar1;
  VkBuffer VVar2;
  VkDeviceSize VVar3;
  VkDeviceSize VVar4;
  VkAllocationCallbacks *pVVar5;
  Context *this_00;
  deUint32 dVar6;
  int iVar7;
  TextureFormat format;
  DeviceInterface *pDVar8;
  VkDevice pVVar9;
  Allocator *pAVar10;
  DescriptorSetLayoutBuilder *this_01;
  DescriptorPoolBuilder *this_02;
  InstanceInterface *vki;
  VkPhysicalDevice physDevice;
  DescriptorSetUpdateBuilder *this_03;
  undefined8 uVar11;
  long lVar12;
  float *pfVar13;
  VkDescriptorBufferInfo resultBufferInfo;
  DescriptorSetLayoutBuilder local_e8;
  Move<vk::Handle<(vk::HandleType)19>_> local_98;
  Unique<vk::Handle<(vk::HandleType)22>_> *local_78;
  Unique<vk::Handle<(vk::HandleType)17>_> *local_70;
  Unique<vk::Handle<(vk::HandleType)21>_> *local_68;
  Unique<vk::Handle<(vk::HandleType)23>_> *local_60;
  Unique<vk::Handle<(vk::HandleType)19>_> *local_58;
  Buffer *local_50;
  Buffer *local_48;
  vector<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription>_>
  *local_40;
  Context *local_38;
  
  uVar11 = caseDef._8_8_;
  (this->super_TestInstance).m_context = context;
  (this->super_TestInstance)._vptr_TestInstance = (_func_int **)&PTR__BaseTestInstance_00d2eee8;
  (this->m_caseDef).primitiveType = (int)caseDef._0_8_;
  (this->m_caseDef).spacingMode = (int)((ulong)caseDef._0_8_ >> 0x20);
  (this->m_caseDef).winding = (int)uVar11;
  (this->m_caseDef).usePointMode = (bool)(char)((ulong)uVar11 >> 0x20);
  *(int3 *)&(this->m_caseDef).field_0xd = (int3)((ulong)uVar11 >> 0x28);
  this->m_numPatchesToDraw = numPatchesToDraw;
  this->m_vertexFormat = VK_FORMAT_R32_SFLOAT;
  local_38 = context;
  format = ::vk::mapVkFormat(VK_FORMAT_R32_SFLOAT);
  dVar6 = tcu::getPixelSize(format);
  this->m_vertexStride = dVar6;
  outerEdgeDescriptions(&this->m_edgeDescriptions,(this->m_caseDef).primitiveType);
  iVar7 = this->m_numPatchesToDraw;
  lVar12 = 4;
  pfVar13 = (float *)&tessellation::(anonymous_namespace)::InvariantOuterEdge::BaseTestInstance::
                      m_singleOuterEdgeLevels;
  do {
    if (*pfVar13 <=
        *(float *)((long)&tessellation::(anonymous_namespace)::InvariantOuterEdge::BaseTestInstance
                          ::m_singleOuterEdgeLevels + lVar12) &&
        *(float *)((long)&tessellation::(anonymous_namespace)::InvariantOuterEdge::BaseTestInstance
                          ::m_singleOuterEdgeLevels + lVar12) != *pfVar13) {
      pfVar13 = (float *)((long)&tessellation::(anonymous_namespace)::InvariantOuterEdge::
                                 BaseTestInstance::m_singleOuterEdgeLevels + lVar12);
    }
    lVar12 = lVar12 + 4;
  } while (lVar12 != 0x30);
  local_40 = &this->m_edgeDescriptions;
  generatePatchTessLevels((vector<float,_std::allocator<float>_> *)&local_e8,iVar7,0,*pfVar13);
  iVar7 = multiplePatchReferencePrimitiveCount
                    (caseDef.primitiveType,caseDef.spacingMode,(bool)(caseDef.usePointMode & 1),
                     (float *)local_e8.m_bindings.
                              super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                              ._M_impl.super__Vector_impl_data._M_start,iVar7);
  if (local_e8.m_bindings.
      super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.m_bindings.
                    super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_e8.m_bindings.
                          super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.m_bindings.
                          super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  this->m_maxNumPrimitivesInDrawCall = iVar7;
  this->m_vertexDataSizeBytes = (ulong)(this->m_numPatchesToDraw * this->m_vertexStride * 6);
  pDVar8 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  pVVar9 = Context::getDevice((this->super_TestInstance).m_context);
  pAVar10 = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  makeBufferCreateInfo((VkBufferCreateInfo *)&local_e8,this->m_vertexDataSizeBytes,0x80);
  tessellation::Buffer::Buffer
            (&this->m_vertexBuffer,pDVar8,pVVar9,pAVar10,(VkBufferCreateInfo *)&local_e8,
             (MemoryRequirement)0x1);
  this->m_resultBufferPrimitiveDataOffset = 0x10;
  this->m_resultBufferSizeBytes = (long)this->m_maxNumPrimitivesInDrawCall << 6 | 0x10;
  local_48 = &this->m_vertexBuffer;
  pDVar8 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  pVVar9 = Context::getDevice((this->super_TestInstance).m_context);
  pAVar10 = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  makeBufferCreateInfo((VkBufferCreateInfo *)&local_e8,this->m_resultBufferSizeBytes,0x20);
  local_50 = &this->m_resultBuffer;
  tessellation::Buffer::Buffer
            (local_50,pDVar8,pVVar9,pAVar10,(VkBufferCreateInfo *)&local_e8,(MemoryRequirement)0x1);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder(&local_e8);
  this_01 = ::vk::DescriptorSetLayoutBuilder::addBinding
                      (&local_e8,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1,8,(VkSampler *)0x0);
  this_00 = local_38;
  pDVar8 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  pVVar9 = Context::getDevice((this->super_TestInstance).m_context);
  ::vk::DescriptorSetLayoutBuilder::build(&local_98,this_01,pDVar8,pVVar9,0);
  pVVar5 = local_98.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_allocator;
  pUVar1 = &this->m_descriptorSetLayout;
  resultBufferInfo.range =
       (VkDeviceSize)local_98.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_device
  ;
  resultBufferInfo.buffer.m_internal =
       local_98.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal;
  resultBufferInfo.offset =
       (VkDeviceSize)
       local_98.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_deviceIface;
  (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
  m_device = local_98.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_device;
  (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
  m_allocator = local_98.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_allocator;
  (pUVar1->super_RefBase<vk::Handle<(vk::HandleType)19>_>).m_data.object.m_internal =
       local_98.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal;
  (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
  m_deviceIface =
       local_98.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_deviceIface;
  local_98.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal = 0;
  local_98.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_98.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_98.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  if (local_e8.m_immutableSamplers.
      super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.m_immutableSamplers.
                    super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_e8.m_immutableSamplers.
                          super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.m_immutableSamplers.
                          super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_e8.m_immutableSamplerInfos.
      super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.m_immutableSamplerInfos.
                    super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_e8.m_immutableSamplerInfos.
                          super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.m_immutableSamplerInfos.
                          super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_e8.m_bindings.
      super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.m_bindings.
                    super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_e8.m_bindings.
                          super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.m_bindings.
                          super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_58 = pUVar1;
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)&local_98);
  this_02 = ::vk::DescriptorPoolBuilder::addType
                      ((DescriptorPoolBuilder *)&local_98,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1);
  pDVar8 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  pVVar9 = Context::getDevice((this->super_TestInstance).m_context);
  ::vk::DescriptorPoolBuilder::build
            ((Move<vk::Handle<(vk::HandleType)21>_> *)&resultBufferInfo,this_02,pDVar8,pVVar9,1,1);
  local_68 = &this->m_descriptorPool;
  local_e8.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)resultBufferInfo.range;
  local_e8.m_immutableSamplerInfos.
  super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)pVVar5;
  local_e8.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)resultBufferInfo.buffer.m_internal;
  local_e8.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)resultBufferInfo.offset;
  (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device =
       (VkDevice)resultBufferInfo.range;
  (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_allocator
       = pVVar5;
  (local_68->super_RefBase<vk::Handle<(vk::HandleType)21>_>).m_data.object.m_internal =
       resultBufferInfo.buffer.m_internal;
  (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)resultBufferInfo.offset;
  resultBufferInfo.buffer.m_internal = 0;
  resultBufferInfo.offset = 0;
  resultBufferInfo.range = 0;
  if ((void *)local_98.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal !=
      (void *)0x0) {
    operator_delete((void *)local_98.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.
                            m_internal,
                    (long)local_98.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
                          m_device -
                    local_98.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal
                   );
  }
  pDVar8 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  pVVar9 = Context::getDevice((this->super_TestInstance).m_context);
  makeDescriptorSet((Move<vk::Handle<(vk::HandleType)22>_> *)&resultBufferInfo,pDVar8,pVVar9,
                    (VkDescriptorPool)
                    (local_68->super_RefBase<vk::Handle<(vk::HandleType)21>_>).m_data.object.
                    m_internal,
                    (VkDescriptorSetLayout)
                    (pUVar1->super_RefBase<vk::Handle<(vk::HandleType)19>_>).m_data.object.
                    m_internal);
  VVar4 = resultBufferInfo.range;
  VVar3 = resultBufferInfo.offset;
  VVar2 = resultBufferInfo.buffer;
  local_78 = &this->m_descriptorSet;
  local_e8.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)resultBufferInfo.range;
  local_e8.m_immutableSamplerInfos.
  super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)resultBufferInfo.buffer.m_internal;
  local_e8.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)resultBufferInfo.offset;
  resultBufferInfo.buffer.m_internal = 0;
  resultBufferInfo.offset = 0;
  resultBufferInfo.range = 0;
  (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device =
       (VkDevice)VVar4;
  (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.
  m_internal = 0;
  (local_78->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.object.m_internal =
       VVar2.m_internal;
  (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)VVar3;
  pDVar8 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  pVVar9 = Context::getDevice((this->super_TestInstance).m_context);
  makeRenderPassWithoutAttachments
            ((Move<vk::Handle<(vk::HandleType)17>_> *)&resultBufferInfo,pDVar8,pVVar9);
  VVar4 = resultBufferInfo.range;
  VVar3 = resultBufferInfo.offset;
  VVar2 = resultBufferInfo.buffer;
  local_70 = &this->m_renderPass;
  local_e8.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)resultBufferInfo.range;
  local_e8.m_immutableSamplerInfos.
  super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)resultBufferInfo.buffer.m_internal;
  local_e8.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)resultBufferInfo.offset;
  resultBufferInfo.buffer.m_internal = 0;
  resultBufferInfo.offset = 0;
  resultBufferInfo.range = 0;
  (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device =
       (VkDevice)VVar4;
  (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (local_70->super_RefBase<vk::Handle<(vk::HandleType)17>_>).m_data.object.m_internal =
       VVar2.m_internal;
  (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)VVar3;
  pDVar8 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  pVVar9 = Context::getDevice((this->super_TestInstance).m_context);
  makeFramebufferWithoutAttachments
            ((Move<vk::Handle<(vk::HandleType)23>_> *)&resultBufferInfo,pDVar8,pVVar9,
             (VkRenderPass)
             (local_70->super_RefBase<vk::Handle<(vk::HandleType)17>_>).m_data.object.m_internal);
  VVar4 = resultBufferInfo.range;
  VVar3 = resultBufferInfo.offset;
  VVar2 = resultBufferInfo.buffer;
  local_60 = &this->m_framebuffer;
  local_e8.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)resultBufferInfo.range;
  local_e8.m_immutableSamplerInfos.
  super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)resultBufferInfo.buffer.m_internal;
  local_e8.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)resultBufferInfo.offset;
  resultBufferInfo.buffer.m_internal = 0;
  resultBufferInfo.offset = 0;
  resultBufferInfo.range = 0;
  (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device =
       (VkDevice)VVar4;
  (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (local_60->super_RefBase<vk::Handle<(vk::HandleType)23>_>).m_data.object.m_internal =
       VVar2.m_internal;
  (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_deviceIface
       = (DeviceInterface *)VVar3;
  pDVar8 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  pVVar9 = Context::getDevice((this->super_TestInstance).m_context);
  makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)&resultBufferInfo,pDVar8,pVVar9,
                     (VkDescriptorSetLayout)
                     (pUVar1->super_RefBase<vk::Handle<(vk::HandleType)19>_>).m_data.object.
                     m_internal);
  VVar4 = resultBufferInfo.range;
  VVar3 = resultBufferInfo.offset;
  VVar2 = resultBufferInfo.buffer;
  local_e8.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)resultBufferInfo.range;
  local_e8.m_immutableSamplerInfos.
  super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)resultBufferInfo.buffer.m_internal;
  local_e8.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)resultBufferInfo.offset;
  resultBufferInfo.buffer.m_internal = 0;
  resultBufferInfo.offset = 0;
  resultBufferInfo.range = 0;
  (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_device =
       (VkDevice)VVar4;
  (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_allocator
       = (VkAllocationCallbacks *)0x0;
  (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.m_internal =
       VVar2.m_internal;
  (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)VVar3;
  pDVar8 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  pVVar9 = Context::getDevice((this->super_TestInstance).m_context);
  dVar6 = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  makeCommandPool((Move<vk::Handle<(vk::HandleType)24>_> *)&resultBufferInfo,pDVar8,pVVar9,dVar6);
  VVar4 = resultBufferInfo.range;
  VVar3 = resultBufferInfo.offset;
  VVar2 = resultBufferInfo.buffer;
  local_e8.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)resultBufferInfo.range;
  local_e8.m_immutableSamplerInfos.
  super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)resultBufferInfo.buffer.m_internal;
  local_e8.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)resultBufferInfo.offset;
  resultBufferInfo.buffer.m_internal = 0;
  resultBufferInfo.offset = 0;
  resultBufferInfo.range = 0;
  (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device =
       (VkDevice)VVar4;
  (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal =
       VVar2.m_internal;
  (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)VVar3;
  pDVar8 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  pVVar9 = Context::getDevice((this->super_TestInstance).m_context);
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&resultBufferInfo,pDVar8,pVVar9,
             (VkCommandPool)
             (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.
             m_internal,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  VVar4 = resultBufferInfo.range;
  VVar3 = resultBufferInfo.offset;
  VVar2 = resultBufferInfo.buffer;
  local_e8.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)resultBufferInfo.range;
  local_e8.m_immutableSamplerInfos.
  super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)resultBufferInfo.buffer.m_internal;
  local_e8.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)resultBufferInfo.offset;
  resultBufferInfo.buffer.m_internal = 0;
  resultBufferInfo.offset = 0;
  resultBufferInfo.range = 0;
  (this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device =
       (VkDevice)VVar4;
  (this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal = 0;
  (this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object =
       (VkCommandBuffer_s *)VVar2.m_internal;
  (this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)VVar3;
  vki = Context::getInstanceInterface(this_00);
  physDevice = Context::getPhysicalDevice(this_00);
  requireFeatures(vki,physDevice,0xb);
  resultBufferInfo.range = this->m_resultBufferSizeBytes;
  resultBufferInfo.buffer.m_internal =
       (this->m_resultBuffer).m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
       m_internal;
  resultBufferInfo.offset = 0;
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder
            ((DescriptorSetUpdateBuilder *)&local_e8);
  this_03 = (DescriptorSetUpdateBuilder *)
            ::vk::DescriptorSetUpdateBuilder::write
                      ((DescriptorSetUpdateBuilder *)&local_e8,
                       (int)(local_78->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.object
                            .m_internal,(void *)0x0,0);
  pDVar8 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  pVVar9 = Context::getDevice((this->super_TestInstance).m_context);
  ::vk::DescriptorSetUpdateBuilder::update(this_03,pDVar8,pVVar9);
  if (local_e8.m_immutableSamplers.
      super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.m_immutableSamplers.
                    super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_e8.m_immutableSamplers.
                          super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.m_immutableSamplers.
                          super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_e8.m_immutableSamplerInfos.
      super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.m_immutableSamplerInfos.
                    super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_e8.m_immutableSamplerInfos.
                          super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.m_immutableSamplerInfos.
                          super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ::~vector((vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
             *)&local_e8);
  return;
}

Assistant:

BaseTestInstance::BaseTestInstance (Context& context, const CaseDefinition caseDef, const int numPatchesToDraw)
	: TestInstance							(context)
	, m_caseDef								(caseDef)
	, m_numPatchesToDraw					(numPatchesToDraw)
	, m_vertexFormat						(VK_FORMAT_R32_SFLOAT)
	, m_vertexStride						(tcu::getPixelSize(mapVkFormat(m_vertexFormat)))
	, m_edgeDescriptions					(outerEdgeDescriptions(m_caseDef.primitiveType))
	, m_maxNumPrimitivesInDrawCall			(computeMaxPrimitiveCount(m_numPatchesToDraw, caseDef.primitiveType, caseDef.spacingMode, caseDef.usePointMode, m_singleOuterEdgeLevels))
	, m_vertexDataSizeBytes					(NUM_TESS_LEVELS * m_numPatchesToDraw * m_vertexStride)
	, m_vertexBuffer						(m_context.getDeviceInterface(), m_context.getDevice(), m_context.getDefaultAllocator(),
											makeBufferCreateInfo(m_vertexDataSizeBytes, VK_BUFFER_USAGE_VERTEX_BUFFER_BIT), MemoryRequirement::HostVisible)
	, m_resultBufferPrimitiveDataOffset		((int)sizeof(deInt32) * 4)
	, m_resultBufferSizeBytes				(m_resultBufferPrimitiveDataOffset + m_maxNumPrimitivesInDrawCall * sizeof(PerPrimitive))
	, m_resultBuffer						(m_context.getDeviceInterface(), m_context.getDevice(), m_context.getDefaultAllocator(),
											makeBufferCreateInfo(m_resultBufferSizeBytes, VK_BUFFER_USAGE_STORAGE_BUFFER_BIT), MemoryRequirement::HostVisible)
	, m_descriptorSetLayout					(DescriptorSetLayoutBuilder()
											.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, VK_SHADER_STAGE_GEOMETRY_BIT)
											.build(m_context.getDeviceInterface(), m_context.getDevice()))
	, m_descriptorPool						(DescriptorPoolBuilder()
											.addType(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER)
											.build(m_context.getDeviceInterface(), m_context.getDevice(), VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u))
	, m_descriptorSet						(makeDescriptorSet(m_context.getDeviceInterface(), m_context.getDevice(), *m_descriptorPool, *m_descriptorSetLayout))
	, m_renderPass							(makeRenderPassWithoutAttachments (m_context.getDeviceInterface(), m_context.getDevice()))
	, m_framebuffer							(makeFramebufferWithoutAttachments(m_context.getDeviceInterface(), m_context.getDevice(), *m_renderPass))
	, m_pipelineLayout						(makePipelineLayout               (m_context.getDeviceInterface(), m_context.getDevice(), *m_descriptorSetLayout))
	, m_cmdPool								(makeCommandPool                  (m_context.getDeviceInterface(), m_context.getDevice(), m_context.getUniversalQueueFamilyIndex()))
	, m_cmdBuffer							(allocateCommandBuffer            (m_context.getDeviceInterface(), m_context.getDevice(), *m_cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY))
{
	requireFeatures(context.getInstanceInterface(), context.getPhysicalDevice(),
					FEATURE_TESSELLATION_SHADER | FEATURE_GEOMETRY_SHADER | FEATURE_VERTEX_PIPELINE_STORES_AND_ATOMICS);

	const VkDescriptorBufferInfo resultBufferInfo = makeDescriptorBufferInfo(m_resultBuffer.get(), 0ull, m_resultBufferSizeBytes);

	DescriptorSetUpdateBuilder()
		.writeSingle(*m_descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &resultBufferInfo)
		.update(m_context.getDeviceInterface(), m_context.getDevice());
}